

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

int flattenSubquery(Parse *pParse,Select *p,int iFrom,int isAgg)

{
  undefined1 *puVar1;
  byte *pbVar2;
  byte bVar3;
  byte bVar4;
  int iVar5;
  uint uVar6;
  int iVar7;
  sqlite3 *db;
  char *pcVar8;
  SrcList *pSVar9;
  SrcList *pSVar10;
  ExprList *pEVar11;
  Select *pSVar12;
  Subquery *p_00;
  Table *pTVar13;
  bool bVar14;
  uint uVar15;
  int iVar16;
  u32 uVar17;
  Select *pSVar18;
  Select *pSVar19;
  Expr *pEVar20;
  long lVar21;
  Select *pSVar22;
  ulong uVar23;
  byte bVar24;
  long lVar25;
  undefined8 *puVar26;
  int iVar27;
  Parse *pParse_00;
  undefined8 *puVar28;
  long lVar29;
  SrcItem *pSVar30;
  int *piVar31;
  int *piVar32;
  ulong uVar33;
  long in_FS_OFFSET;
  byte bVar34;
  int iVar36;
  undefined1 auVar35 [16];
  int iVar37;
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  int iVar51;
  int iVar52;
  int iVar54;
  int iVar55;
  undefined1 auVar53 [16];
  undefined1 in_XMM8 [16];
  undefined1 auVar56 [16];
  undefined1 in_XMM9 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  SrcList *local_f8;
  Select *local_f0;
  Select *local_e0;
  SubstContext local_90;
  undefined1 local_68 [32];
  undefined1 *local_48;
  anon_union_8_18_67db040d_for_u aStack_40;
  long local_38;
  
  bVar34 = 0;
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  db = pParse->db;
  piVar32 = (int *)0x0;
  piVar31 = (int *)0x0;
  if ((db->dbOptFlags & 1) == 0) {
    pcVar8 = pParse->zAuthContext;
    aStack_40.pNC = (NameContext *)&DAT_aaaaaaaaaaaaaaaa;
    local_68._16_8_ = &DAT_aaaaaaaaaaaaaaaa;
    local_48 = &DAT_aaaaaaaaaaaaaaaa;
    local_68._24_8_ = &DAT_aaaaaaaaaaaaaaaa;
    local_68._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
    local_68._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
    if (p->pWin == (Window *)0x0) {
      pSVar9 = p->pSrc;
      lVar29 = (long)iFrom;
      pSVar18 = (pSVar9->a[lVar29].u4.pSubq)->pSelect;
      if (pSVar18->pWin == (Window *)0x0) {
        iVar5 = pSVar9->a[lVar29].iCursor;
        pSVar10 = pSVar18->pSrc;
        pEVar20 = pSVar18->pLimit;
        piVar32 = piVar31;
        if (pEVar20 == (Expr *)0x0) {
          uVar15 = p->selFlags;
        }
        else if (((p->pLimit != (Expr *)0x0) || (pEVar20->pRight != (Expr *)0x0)) ||
                (uVar15 = p->selFlags, (uVar15 >> 8 & 1) != 0)) goto LAB_00188d57;
        if (((((pSVar10->nSrc != 0) && (uVar6 = pSVar18->selFlags, (uVar6 & 1) == 0)) &&
             ((pEVar20 == (Expr *)0x0 || ((isAgg == 0 && (pSVar9->nSrc < 2)))))) &&
            ((pEVar11 = p->pOrderBy, pEVar11 == (ExprList *)0x0 ||
             (pSVar18->pOrderBy == (ExprList *)0x0)))) &&
           ((isAgg == 0 || (pSVar18->pOrderBy == (ExprList *)0x0)))) {
          if (pEVar20 == (Expr *)0x0) {
            if ((uVar6 >> 0xd & 1) != 0) goto LAB_00188d57;
          }
          else if ((p->pWhere != (Expr *)0x0) || ((uVar6 & 0x2000) != 0 || (uVar15 & 1) != 0))
          goto LAB_00188d57;
          pSVar30 = pSVar9->a + lVar29;
          bVar3 = pSVar9->a[lVar29].fg.jointype;
          if ((bVar3 & 0x60) == 0) {
            iVar27 = 0;
          }
          else {
            piVar32 = (int *)0x0;
            if (((1 < pSVar10->nSrc) ||
                (piVar32 = (int *)0x0, (pSVar10->a[0].pSTab)->eTabType == '\x01')) ||
               ((bVar3 & 0x10) != 0 || (uVar15 & 1) != 0)) goto LAB_00188d57;
            iVar27 = 1;
          }
          if ((iFrom < 1) || (piVar32 = (int *)0x0, (pSVar10->a[0].fg.jointype & 0x40) == 0)) {
            piVar32 = (int *)0x0;
            if (pSVar18->pPrior != (Select *)0x0) {
              if (((isAgg != 0) || (pSVar18->pOrderBy != (ExprList *)0x0)) ||
                 (pSVar19 = pSVar18, (uVar15 & 1) != 0 || (bVar3 & 0x60) != 0)) goto LAB_00188d57;
              do {
                if ((((pSVar19->selFlags & 9) != 0) ||
                    ((((pSVar12 = pSVar19->pPrior, pSVar12 != (Select *)0x0 && (pSVar19->op != 0x88)
                       ) || (pSVar19->pSrc->nSrc < 1)) || (pSVar19->pWin != (Window *)0x0)))) ||
                   ((0 < iFrom && ((pSVar19->pSrc->a[0].fg.jointype & 0x40) != 0))))
                goto LAB_00188d57;
                pSVar19 = pSVar12;
              } while (pSVar12 != (Select *)0x0);
              if ((pEVar11 != (ExprList *)0x0) && (0 < (long)pEVar11->nExpr)) {
                lVar25 = 0;
                do {
                  if (*(short *)((long)&pEVar11->a[0].u + lVar25) == 0) {
                    piVar32 = (int *)0x0;
                    goto LAB_00188d57;
                  }
                  lVar25 = lVar25 + 0x18;
                } while ((long)pEVar11->nExpr * 0x18 != lVar25);
              }
              if (((uVar15 >> 0xd & 1) != 0) ||
                 (iVar16 = compoundHasDifferentAffinities(pSVar18), iVar16 != 0)) goto LAB_00188d57;
              piVar32 = (int *)0x0;
              if (1 < pSVar9->nSrc) {
                piVar32 = (int *)0x0;
                if ((500 < pParse->nSelect) || ((db->dbOptFlags & 0x800000) != 0))
                goto LAB_00188d57;
                piVar32 = (int *)sqlite3DbMallocZero(db,(long)pParse->nTab * 4 + 4);
                if (piVar32 == (int *)0x0) {
                  piVar32 = (int *)0x0;
                }
                else {
                  *piVar32 = pParse->nTab;
                }
              }
            }
            pParse->zAuthContext = pSVar30->zName;
            local_e0 = (Select *)0x0;
            sqlite3AuthCheck(pParse,0x15,(char *)0x0,(char *)0x0,(char *)0x0);
            pParse->zAuthContext = pcVar8;
            if ((pSVar9->a[lVar29].fg.field_0x1 & 4) != 0) {
              p_00 = pSVar9->a[lVar29].u4.pSubq;
              local_e0 = p_00->pSelect;
              sqlite3DbFreeNN(db,p_00);
              pSVar9->a[lVar29].u4.pSchema = (Schema *)0x0;
              puVar1 = &pSVar9->a[lVar29].fg.field_0x1;
              *puVar1 = *puVar1 & 0xfb;
            }
            if (pSVar30->zName != (char *)0x0) {
              sqlite3DbFreeNN(db,pSVar30->zName);
            }
            pcVar8 = pSVar9->a[lVar29].zAlias;
            if (pcVar8 != (char *)0x0) {
              sqlite3DbFreeNN(db,pcVar8);
            }
            pSVar30->zName = (char *)0x0;
            pSVar30->zAlias = (char *)0x0;
            pSVar18 = pSVar18->pPrior;
            if (pSVar18 != (Select *)0x0) {
              local_f0 = p->pPrior;
              do {
                pEVar11 = p->pOrderBy;
                pEVar20 = p->pLimit;
                pTVar13 = pSVar9->a[lVar29].pSTab;
                pSVar9->a[lVar29].pSTab = (Table *)0x0;
                p->pLimit = (Expr *)0x0;
                p->pOrderBy = (ExprList *)0x0;
                p->pPrior = (Select *)0x0;
                pSVar19 = sqlite3SelectDup(db,p,0);
                p->pLimit = pEVar20;
                p->pOrderBy = pEVar11;
                p->op = 0x88;
                pSVar9->a[lVar29].pSTab = pTVar13;
                if (pSVar19 != (Select *)0x0) {
                  uVar17 = pParse->nSelect + 1;
                  pParse->nSelect = uVar17;
                  pSVar19->selId = uVar17;
                  if ((piVar32 != (int *)0x0) && (db->mallocFailed == '\0')) {
                    renumberCursors(pParse,pSVar19,iFrom,piVar32);
                  }
                  pSVar19->pPrior = local_f0;
                  if (local_f0 != (Select *)0x0) {
                    local_f0->pNext = pSVar19;
                  }
                  pSVar19->pNext = p;
                  local_f0 = pSVar19;
                }
                p->pPrior = local_f0;
                pSVar18 = pSVar18->pPrior;
              } while (pSVar18 != (Select *)0x0);
            }
            if (piVar32 != (int *)0x0) {
              sqlite3DbFreeNN(db,piVar32);
            }
            if (db->mallocFailed == '\0') {
              pTVar13 = pSVar9->a[lVar29].pSTab;
              if (pTVar13 != (Table *)0x0) {
                if (pTVar13->nTabRef == 1) {
                  pParse_00 = pParse->pToplevel;
                  if (pParse->pToplevel == (Parse *)0x0) {
                    pParse_00 = pParse;
                  }
                  sqlite3ParserAddCleanup(pParse_00,sqlite3DeleteTableGeneric,pTVar13);
                }
                else {
                  pTVar13->nTabRef = pTVar13->nTabRef - 1;
                }
                pSVar9->a[lVar29].pSTab = (Table *)0x0;
              }
              if (p != (Select *)0x0) {
                pSVar19 = local_e0;
                pSVar18 = p;
                local_f8 = pSVar9;
                do {
                  if (pSVar18 == p) {
                    bVar24 = pSVar9->a[lVar29].fg.jointype;
                  }
                  else {
                    bVar24 = 0;
                  }
                  bVar4 = local_f8->a[lVar29].fg.jointype;
                  pSVar10 = pSVar19->pSrc;
                  uVar15 = pSVar10->nSrc;
                  uVar23 = (ulong)uVar15;
                  local_f8 = pSVar18->pSrc;
                  if ((int)uVar15 < 2) {
                    iVar16 = pSVar10->a[0].iCursor;
                    if (uVar15 == 1) goto LAB_001892c5;
                    bVar14 = false;
                  }
                  else {
                    local_f8 = sqlite3SrcListEnlarge(pParse,local_f8,uVar15 - 1,iFrom + 1);
                    if (local_f8 == (SrcList *)0x0) break;
                    pSVar18->pSrc = local_f8;
                    iVar16 = pSVar10->a[0].iCursor;
LAB_001892c5:
                    lVar25 = 8;
                    uVar33 = uVar23;
                    do {
                      if ((*(byte *)((long)&local_f8->a[lVar29].pSTab + lVar25 + 2) & 8) != 0) {
                        sqlite3IdListDelete(db,*(IdList **)((long)&local_f8->a[lVar29].u2 + lVar25))
                        ;
                      }
                      puVar26 = (undefined8 *)((long)pSVar10->a + lVar25 + -8);
                      puVar28 = (undefined8 *)((long)local_f8->a + lVar25 + lVar29 * 0x48 + -8);
                      for (lVar21 = 9; lVar21 != 0; lVar21 = lVar21 + -1) {
                        *puVar28 = *puVar26;
                        puVar26 = puVar26 + (ulong)bVar34 * -2 + 1;
                        puVar28 = puVar28 + (ulong)bVar34 * -2 + 1;
                      }
                      pbVar2 = (byte *)((long)&local_f8->a[lVar29].pSTab + lVar25);
                      *pbVar2 = *pbVar2 | bVar4 & 0x40;
                      *(undefined1 (*) [16])((long)&pSVar10->a[0].u1 + lVar25) =
                           (undefined1  [16])0x0;
                      *(undefined1 (*) [16])(&pSVar10->a[0].fg.jointype + lVar25) =
                           (undefined1  [16])0x0;
                      *(undefined1 (*) [16])((long)&pSVar10->a[0].zAlias + lVar25) =
                           (undefined1  [16])0x0;
                      *(undefined1 (*) [16])((long)pSVar10->a + lVar25 + -8) = (undefined1  [16])0x0
                      ;
                      *(undefined8 *)((long)&pSVar10->a[0].u3 + lVar25) = 0;
                      lVar25 = lVar25 + 0x48;
                      uVar33 = uVar33 - 1;
                    } while (uVar33 != 0);
                    bVar14 = true;
                  }
                  local_f8->a[lVar29].fg.jointype =
                       bVar24 | bVar4 & 0x40 | local_f8->a[lVar29].fg.jointype & 0x40;
                  pEVar11 = pSVar19->pOrderBy;
                  if ((pEVar11 != (ExprList *)0x0) && ((pSVar18->selFlags & 0x400000) == 0)) {
                    iVar7 = pEVar11->nExpr;
                    if (0 < (long)iVar7) {
                      lVar25 = (long)iVar7 + -1;
                      auVar35._8_4_ = (int)lVar25;
                      auVar35._0_8_ = lVar25;
                      auVar35._12_4_ = (int)((ulong)lVar25 >> 0x20);
                      auVar35 = auVar35 ^ _DAT_001ff0a0;
                      lVar25 = 0;
                      auVar38 = _DAT_001ff090;
                      auVar39 = _DAT_001ff080;
                      auVar40 = _DAT_001ff070;
                      auVar41 = _DAT_001ff060;
                      do {
                        auVar42 = auVar38 ^ _DAT_001ff0a0;
                        iVar52 = auVar35._0_4_;
                        iVar51 = -(uint)(iVar52 < auVar42._0_4_);
                        iVar36 = auVar35._4_4_;
                        auVar43._4_4_ = -(uint)(iVar36 < auVar42._4_4_);
                        iVar55 = auVar35._8_4_;
                        iVar54 = -(uint)(iVar55 < auVar42._8_4_);
                        iVar37 = auVar35._12_4_;
                        auVar43._12_4_ = -(uint)(iVar37 < auVar42._12_4_);
                        auVar48._4_4_ = iVar51;
                        auVar48._0_4_ = iVar51;
                        auVar48._8_4_ = iVar54;
                        auVar48._12_4_ = iVar54;
                        auVar56 = pshuflw(in_XMM8,auVar48,0xe8);
                        auVar47._4_4_ = -(uint)(auVar42._4_4_ == iVar36);
                        auVar47._12_4_ = -(uint)(auVar42._12_4_ == iVar37);
                        auVar47._0_4_ = auVar47._4_4_;
                        auVar47._8_4_ = auVar47._12_4_;
                        auVar57 = pshuflw(in_XMM9,auVar47,0xe8);
                        auVar43._0_4_ = auVar43._4_4_;
                        auVar43._8_4_ = auVar43._12_4_;
                        auVar42 = pshuflw(auVar56,auVar43,0xe8);
                        auVar58._8_4_ = 0xffffffff;
                        auVar58._0_8_ = 0xffffffffffffffff;
                        auVar58._12_4_ = 0xffffffff;
                        auVar42 = (auVar42 | auVar57 & auVar56) ^ auVar58;
                        auVar42 = packssdw(auVar42,auVar42);
                        if ((auVar42 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
                          *(undefined2 *)((long)&pEVar11->a[0].u + lVar25) = 0;
                        }
                        auVar43 = auVar47 & auVar48 | auVar43;
                        auVar42 = packssdw(auVar43,auVar43);
                        auVar42 = packssdw(auVar42 ^ auVar58,auVar42 ^ auVar58);
                        if ((auVar42._0_4_ >> 0x10 & 1) != 0) {
                          *(undefined2 *)((long)&pEVar11[1].a[0].zEName + lVar25 + 4) = 0;
                        }
                        auVar47 = auVar39 ^ _DAT_001ff0a0;
                        iVar51 = -(uint)(iVar52 < auVar47._0_4_);
                        auVar57._4_4_ = -(uint)(iVar36 < auVar47._4_4_);
                        iVar54 = -(uint)(iVar55 < auVar47._8_4_);
                        auVar57._12_4_ = -(uint)(iVar37 < auVar47._12_4_);
                        auVar42._4_4_ = iVar51;
                        auVar42._0_4_ = iVar51;
                        auVar42._8_4_ = iVar54;
                        auVar42._12_4_ = iVar54;
                        auVar56._4_4_ = -(uint)(auVar47._4_4_ == iVar36);
                        auVar56._12_4_ = -(uint)(auVar47._12_4_ == iVar37);
                        auVar56._0_4_ = auVar56._4_4_;
                        auVar56._8_4_ = auVar56._12_4_;
                        auVar57._0_4_ = auVar57._4_4_;
                        auVar57._8_4_ = auVar57._12_4_;
                        auVar47 = auVar56 & auVar42 | auVar57;
                        auVar47 = packssdw(auVar47,auVar47);
                        auVar47 = packssdw(auVar47 ^ auVar58,auVar47 ^ auVar58);
                        if ((auVar47 & (undefined1  [16])0x100000000) != (undefined1  [16])0x0) {
                          *(undefined2 *)((long)&pEVar11[2].a[0].pExpr + lVar25 + 4) = 0;
                        }
                        auVar42 = pshufhw(auVar42,auVar42,0x84);
                        auVar48 = pshufhw(auVar56,auVar56,0x84);
                        auVar43 = pshufhw(auVar42,auVar57,0x84);
                        auVar42 = (auVar43 | auVar48 & auVar42) ^ auVar58;
                        auVar42 = packssdw(auVar42,auVar42);
                        if ((auVar42 & (undefined1  [16])0x1000000000000) != (undefined1  [16])0x0)
                        {
                          *(undefined2 *)((long)pEVar11[3].a + lVar25 + -4) = 0;
                        }
                        auVar42 = auVar40 ^ _DAT_001ff0a0;
                        iVar51 = -(uint)(iVar52 < auVar42._0_4_);
                        auVar45._4_4_ = -(uint)(iVar36 < auVar42._4_4_);
                        iVar54 = -(uint)(iVar55 < auVar42._8_4_);
                        auVar45._12_4_ = -(uint)(iVar37 < auVar42._12_4_);
                        auVar49._4_4_ = iVar51;
                        auVar49._0_4_ = iVar51;
                        auVar49._8_4_ = iVar54;
                        auVar49._12_4_ = iVar54;
                        auVar47 = pshuflw(auVar47,auVar49,0xe8);
                        auVar44._4_4_ = -(uint)(auVar42._4_4_ == iVar36);
                        auVar44._12_4_ = -(uint)(auVar42._12_4_ == iVar37);
                        auVar44._0_4_ = auVar44._4_4_;
                        auVar44._8_4_ = auVar44._12_4_;
                        auVar43 = pshuflw(auVar58,auVar44,0xe8);
                        auVar45._0_4_ = auVar45._4_4_;
                        auVar45._8_4_ = auVar45._12_4_;
                        auVar42 = pshuflw(auVar47,auVar45,0xe8);
                        in_XMM9._8_4_ = 0xffffffff;
                        in_XMM9._0_8_ = 0xffffffffffffffff;
                        in_XMM9._12_4_ = 0xffffffff;
                        auVar42 = (auVar42 | auVar43 & auVar47) ^ in_XMM9;
                        auVar42 = packssdw(auVar42,auVar42);
                        if ((auVar42 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
                          *(undefined2 *)((long)&pEVar11[3].a[0].u + lVar25) = 0;
                        }
                        auVar45 = auVar44 & auVar49 | auVar45;
                        auVar42 = packssdw(auVar45,auVar45);
                        auVar42 = packssdw(auVar42 ^ in_XMM9,auVar42 ^ in_XMM9);
                        if ((auVar42 & (undefined1  [16])0x10000) != (undefined1  [16])0x0) {
                          *(undefined2 *)((long)&pEVar11[4].a[0].zEName + lVar25 + 4) = 0;
                        }
                        auVar42 = auVar41 ^ _DAT_001ff0a0;
                        iVar52 = -(uint)(iVar52 < auVar42._0_4_);
                        auVar53._4_4_ = -(uint)(iVar36 < auVar42._4_4_);
                        iVar55 = -(uint)(iVar55 < auVar42._8_4_);
                        auVar53._12_4_ = -(uint)(iVar37 < auVar42._12_4_);
                        auVar46._4_4_ = iVar52;
                        auVar46._0_4_ = iVar52;
                        auVar46._8_4_ = iVar55;
                        auVar46._12_4_ = iVar55;
                        auVar50._4_4_ = -(uint)(auVar42._4_4_ == iVar36);
                        auVar50._12_4_ = -(uint)(auVar42._12_4_ == iVar37);
                        auVar50._0_4_ = auVar50._4_4_;
                        auVar50._8_4_ = auVar50._12_4_;
                        auVar53._0_4_ = auVar53._4_4_;
                        auVar53._8_4_ = auVar53._12_4_;
                        auVar42 = auVar50 & auVar46 | auVar53;
                        auVar42 = packssdw(auVar42,auVar42);
                        in_XMM8 = packssdw(auVar42 ^ in_XMM9,auVar42 ^ in_XMM9);
                        if ((in_XMM8 & (undefined1  [16])0x100000000) != (undefined1  [16])0x0) {
                          *(undefined2 *)((long)&pEVar11[5].a[0].pExpr + lVar25 + 4) = 0;
                        }
                        auVar42 = pshufhw(auVar46,auVar46,0x84);
                        auVar43 = pshufhw(auVar50,auVar50,0x84);
                        auVar47 = pshufhw(auVar42,auVar53,0x84);
                        auVar42 = (auVar47 | auVar43 & auVar42) ^ in_XMM9;
                        auVar42 = packssdw(auVar42,auVar42);
                        if ((auVar42 & (undefined1  [16])0x1000000000000) != (undefined1  [16])0x0)
                        {
                          *(undefined2 *)((long)pEVar11[6].a + lVar25 + -4) = 0;
                        }
                        lVar21 = auVar38._8_8_;
                        auVar38._0_8_ = auVar38._0_8_ + 8;
                        auVar38._8_8_ = lVar21 + 8;
                        lVar21 = auVar39._8_8_;
                        auVar39._0_8_ = auVar39._0_8_ + 8;
                        auVar39._8_8_ = lVar21 + 8;
                        lVar21 = auVar40._8_8_;
                        auVar40._0_8_ = auVar40._0_8_ + 8;
                        auVar40._8_8_ = lVar21 + 8;
                        lVar21 = auVar41._8_8_;
                        auVar41._0_8_ = auVar41._0_8_ + 8;
                        auVar41._8_8_ = lVar21 + 8;
                        lVar25 = lVar25 + 0xc0;
                      } while ((ulong)(iVar7 + 7U >> 3) * 0xc0 != lVar25);
                    }
                    pSVar18->pOrderBy = pEVar11;
                    pSVar19->pOrderBy = (ExprList *)0x0;
                  }
                  pEVar20 = pSVar19->pWhere;
                  pSVar19->pWhere = (Expr *)0x0;
                  if ((bVar3 & 0x60) != 0) {
                    sqlite3SetJoinExpr(pEVar20,iVar16,1);
                  }
                  if (pEVar20 != (Expr *)0x0) {
                    if (pSVar18->pWhere != (Expr *)0x0) {
                      pEVar20 = sqlite3PExpr(pParse,0x2c,pEVar20,pSVar18->pWhere);
                    }
                    pSVar18->pWhere = pEVar20;
                  }
                  if (db->mallocFailed == '\0') {
                    local_90._20_4_ = 0xaaaaaaaa;
                    local_90.pEList = pSVar19->pEList;
                    pSVar12 = pSVar19;
                    do {
                      pSVar22 = pSVar12;
                      pSVar12 = pSVar22->pPrior;
                    } while (pSVar12 != (Select *)0x0);
                    local_90.pCList = pSVar22->pEList;
                    local_90.pParse = pParse;
                    local_90.iTable = iVar5;
                    local_90.iNewTable = iVar16;
                    local_90.isOuterJoin = iVar27;
                    substSelect(&local_90,pSVar18,0);
                  }
                  pSVar18->selFlags = pSVar18->selFlags | pSVar19->selFlags & 0x100;
                  if (pSVar19->pLimit != (Expr *)0x0) {
                    pSVar18->pLimit = pSVar19->pLimit;
                    pSVar19->pLimit = (Expr *)0x0;
                  }
                  if (bVar14) {
                    pSVar30 = local_f8->a + lVar29;
                    do {
                      recomputeColumnsUsed(pSVar18,pSVar30);
                      pSVar30 = pSVar30 + 1;
                      uVar23 = uVar23 - 1;
                    } while (uVar23 != 0);
                  }
                  pSVar18 = pSVar18->pPrior;
                  pSVar19 = pSVar19->pPrior;
                } while (pSVar18 != (Select *)0x0);
              }
              stack0xffffffffffffffb0 = (undefined1  [16])0x0;
              aStack_40.pNC = (NameContext *)0x0;
              local_68._8_8_ = agginfoPersistExprCb;
              local_68._16_8_ = sqlite3SelectWalkNoop;
              local_68._0_8_ = pParse;
              sqlite3WalkSelect((Walker *)local_68,local_e0);
              if (local_e0 != (Select *)0x0) {
                clearSelect(db,local_e0,1);
                piVar32 = (int *)0x1;
                goto LAB_00188d57;
              }
            }
            else {
              sqlite3SrcItemAttachSubquery(pParse,pSVar30,local_e0,0);
            }
            piVar32 = (int *)0x1;
          }
        }
      }
    }
  }
LAB_00188d57:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return (int)piVar32;
}

Assistant:

static int flattenSubquery(
  Parse *pParse,       /* Parsing context */
  Select *p,           /* The parent or outer SELECT statement */
  int iFrom,           /* Index in p->pSrc->a[] of the inner subquery */
  int isAgg            /* True if outer SELECT uses aggregate functions */
){
  const char *zSavedAuthContext = pParse->zAuthContext;
  Select *pParent;    /* Current UNION ALL term of the other query */
  Select *pSub;       /* The inner query or "subquery" */
  Select *pSub1;      /* Pointer to the rightmost select in sub-query */
  SrcList *pSrc;      /* The FROM clause of the outer query */
  SrcList *pSubSrc;   /* The FROM clause of the subquery */
  int iParent;        /* VDBE cursor number of the pSub result set temp table */
  int iNewParent = -1;/* Replacement table for iParent */
  int isOuterJoin = 0; /* True if pSub is the right side of a LEFT JOIN */
  int i;              /* Loop counter */
  Expr *pWhere;                    /* The WHERE clause */
  SrcItem *pSubitem;               /* The subquery */
  sqlite3 *db = pParse->db;
  Walker w;                        /* Walker to persist agginfo data */
  int *aCsrMap = 0;

  /* Check to see if flattening is permitted.  Return 0 if not.
  */
  assert( p!=0 );
  assert( p->pPrior==0 );
  if( OptimizationDisabled(db, SQLITE_QueryFlattener) ) return 0;
  pSrc = p->pSrc;
  assert( pSrc && iFrom>=0 && iFrom<pSrc->nSrc );
  pSubitem = &pSrc->a[iFrom];
  iParent = pSubitem->iCursor;
  assert( pSubitem->fg.isSubquery );
  pSub = pSubitem->u4.pSubq->pSelect;
  assert( pSub!=0 );

#ifndef SQLITE_OMIT_WINDOWFUNC
  if( p->pWin || pSub->pWin ) return 0;                  /* Restriction (25) */
#endif

  pSubSrc = pSub->pSrc;
  assert( pSubSrc );
  /* Prior to version 3.1.2, when LIMIT and OFFSET had to be simple constants,
  ** not arbitrary expressions, we allowed some combining of LIMIT and OFFSET
  ** because they could be computed at compile-time.  But when LIMIT and OFFSET
  ** became arbitrary expressions, we were forced to add restrictions (13)
  ** and (14). */
  if( pSub->pLimit && p->pLimit ) return 0;              /* Restriction (13) */
  if( pSub->pLimit && pSub->pLimit->pRight ) return 0;   /* Restriction (14) */
  if( (p->selFlags & SF_Compound)!=0 && pSub->pLimit ){
    return 0;                                            /* Restriction (15) */
  }
  if( pSubSrc->nSrc==0 ) return 0;                       /* Restriction (7)  */
  if( pSub->selFlags & SF_Distinct ) return 0;           /* Restriction (4)  */
  if( pSub->pLimit && (pSrc->nSrc>1 || isAgg) ){
     return 0;         /* Restrictions (8)(9) */
  }
  if( p->pOrderBy && pSub->pOrderBy ){
     return 0;                                           /* Restriction (11) */
  }
  if( isAgg && pSub->pOrderBy ) return 0;                /* Restriction (16) */
  if( pSub->pLimit && p->pWhere ) return 0;              /* Restriction (19) */
  if( pSub->pLimit && (p->selFlags & SF_Distinct)!=0 ){
     return 0;         /* Restriction (21) */
  }
  if( pSub->selFlags & (SF_Recursive) ){
    return 0; /* Restrictions (22) */
  }

  /*
  ** If the subquery is the right operand of a LEFT JOIN, then the
  ** subquery may not be a join itself (3a). Example of why this is not
  ** allowed:
  **
  **         t1 LEFT OUTER JOIN (t2 JOIN t3)
  **
  ** If we flatten the above, we would get
  **
  **         (t1 LEFT OUTER JOIN t2) JOIN t3
  **
  ** which is not at all the same thing.
  **
  ** See also tickets #306, #350, and #3300.
  */
  if( (pSubitem->fg.jointype & (JT_OUTER|JT_LTORJ))!=0 ){
    if( pSubSrc->nSrc>1                        /* (3a) */
     || IsVirtual(pSubSrc->a[0].pSTab)         /* (3b) */
     || (p->selFlags & SF_Distinct)!=0         /* (3d) */
     || (pSubitem->fg.jointype & JT_RIGHT)!=0  /* (26) */
    ){
      return 0;
    }
    isOuterJoin = 1;
  }

  assert( pSubSrc->nSrc>0 );  /* True by restriction (7) */
  if( iFrom>0 && (pSubSrc->a[0].fg.jointype & JT_LTORJ)!=0 ){
    return 0;   /* Restriction (27a) */
  }

  /* Condition (28) is blocked by the caller */
  assert( !pSubitem->fg.isCte || pSubitem->u2.pCteUse->eM10d!=M10d_Yes );

  /* Restriction (17): If the sub-query is a compound SELECT, then it must
  ** use only the UNION ALL operator. And none of the simple select queries
  ** that make up the compound SELECT are allowed to be aggregate or distinct
  ** queries.
  */
  if( pSub->pPrior ){
    int ii;
    if( pSub->pOrderBy ){
      return 0;  /* Restriction (20) */
    }
    if( isAgg || (p->selFlags & SF_Distinct)!=0 || isOuterJoin>0 ){
      return 0; /* (17d1), (17d2), or (17f) */
    }
    for(pSub1=pSub; pSub1; pSub1=pSub1->pPrior){
      testcase( (pSub1->selFlags & (SF_Distinct|SF_Aggregate))==SF_Distinct );
      testcase( (pSub1->selFlags & (SF_Distinct|SF_Aggregate))==SF_Aggregate );
      assert( pSub->pSrc!=0 );
      assert( (pSub->selFlags & SF_Recursive)==0 );
      assert( pSub->pEList->nExpr==pSub1->pEList->nExpr );
      if( (pSub1->selFlags & (SF_Distinct|SF_Aggregate))!=0    /* (17b) */
       || (pSub1->pPrior && pSub1->op!=TK_ALL)                 /* (17a) */
       || pSub1->pSrc->nSrc<1                                  /* (17c) */
#ifndef SQLITE_OMIT_WINDOWFUNC
       || pSub1->pWin                                          /* (17e) */
#endif
      ){
        return 0;
      }
      if( iFrom>0 && (pSub1->pSrc->a[0].fg.jointype & JT_LTORJ)!=0 ){
        /* Without this restriction, the JT_LTORJ flag would end up being
        ** omitted on left-hand tables of the right join that is being
        ** flattened. */
        return 0;   /* Restrictions (17g), (27b) */
      }
      testcase( pSub1->pSrc->nSrc>1 );
    }

    /* Restriction (18). */
    if( p->pOrderBy ){
      for(ii=0; ii<p->pOrderBy->nExpr; ii++){
        if( p->pOrderBy->a[ii].u.x.iOrderByCol==0 ) return 0;
      }
    }

    /* Restriction (23) */
    if( (p->selFlags & SF_Recursive) ) return 0;

    /* Restriction (17h) */
    if( compoundHasDifferentAffinities(pSub) ) return 0;

    if( pSrc->nSrc>1 ){
      if( pParse->nSelect>500 ) return 0;
      if( OptimizationDisabled(db, SQLITE_FlttnUnionAll) ) return 0;
      aCsrMap = sqlite3DbMallocZero(db, ((i64)pParse->nTab+1)*sizeof(int));
      if( aCsrMap ) aCsrMap[0] = pParse->nTab;
    }
  }

  /***** If we reach this point, flattening is permitted. *****/
  TREETRACE(0x4,pParse,p,("flatten %u.%p from term %d\n",
                   pSub->selId, pSub, iFrom));

  /* Authorize the subquery */
  pParse->zAuthContext = pSubitem->zName;
  TESTONLY(i =) sqlite3AuthCheck(pParse, SQLITE_SELECT, 0, 0, 0);
  testcase( i==SQLITE_DENY );
  pParse->zAuthContext = zSavedAuthContext;

  /* Delete the transient structures associated with the subquery */

  if( ALWAYS(pSubitem->fg.isSubquery) ){
    pSub1 = sqlite3SubqueryDetach(db, pSubitem);
  }else{
    pSub1 = 0;
  }
  assert( pSubitem->fg.isSubquery==0 );
  assert( pSubitem->fg.fixedSchema==0 );
  sqlite3DbFree(db, pSubitem->zName);
  sqlite3DbFree(db, pSubitem->zAlias);
  pSubitem->zName = 0;
  pSubitem->zAlias = 0;
  assert( pSubitem->fg.isUsing!=0 || pSubitem->u3.pOn==0 );

  /* If the sub-query is a compound SELECT statement, then (by restrictions
  ** 17 and 18 above) it must be a UNION ALL and the parent query must
  ** be of the form:
  **
  **     SELECT <expr-list> FROM (<sub-query>) <where-clause>
  **
  ** followed by any ORDER BY, LIMIT and/or OFFSET clauses. This block
  ** creates N-1 copies of the parent query without any ORDER BY, LIMIT or
  ** OFFSET clauses and joins them to the left-hand-side of the original
  ** using UNION ALL operators. In this case N is the number of simple
  ** select statements in the compound sub-query.
  **
  ** Example:
  **
  **     SELECT a+1 FROM (
  **        SELECT x FROM tab
  **        UNION ALL
  **        SELECT y FROM tab
  **        UNION ALL
  **        SELECT abs(z*2) FROM tab2
  **     ) WHERE a!=5 ORDER BY 1
  **
  ** Transformed into:
  **
  **     SELECT x+1 FROM tab WHERE x+1!=5
  **     UNION ALL
  **     SELECT y+1 FROM tab WHERE y+1!=5
  **     UNION ALL
  **     SELECT abs(z*2)+1 FROM tab2 WHERE abs(z*2)+1!=5
  **     ORDER BY 1
  **
  ** We call this the "compound-subquery flattening".
  */
  for(pSub=pSub->pPrior; pSub; pSub=pSub->pPrior){
    Select *pNew;
    ExprList *pOrderBy = p->pOrderBy;
    Expr *pLimit = p->pLimit;
    Select *pPrior = p->pPrior;
    Table *pItemTab = pSubitem->pSTab;
    pSubitem->pSTab = 0;
    p->pOrderBy = 0;
    p->pPrior = 0;
    p->pLimit = 0;
    pNew = sqlite3SelectDup(db, p, 0);
    p->pLimit = pLimit;
    p->pOrderBy = pOrderBy;
    p->op = TK_ALL;
    pSubitem->pSTab = pItemTab;
    if( pNew==0 ){
      p->pPrior = pPrior;
    }else{
      pNew->selId = ++pParse->nSelect;
      if( aCsrMap && ALWAYS(db->mallocFailed==0) ){
        renumberCursors(pParse, pNew, iFrom, aCsrMap);
      }
      pNew->pPrior = pPrior;
      if( pPrior ) pPrior->pNext = pNew;
      pNew->pNext = p;
      p->pPrior = pNew;
      TREETRACE(0x4,pParse,p,("compound-subquery flattener"
                              " creates %u as peer\n",pNew->selId));
    }
    assert( pSubitem->fg.isSubquery==0 );
  }
  sqlite3DbFree(db, aCsrMap);
  if( db->mallocFailed ){
    assert( pSubitem->fg.fixedSchema==0 );
    assert( pSubitem->fg.isSubquery==0 );
    assert( pSubitem->u4.zDatabase==0 );
    sqlite3SrcItemAttachSubquery(pParse, pSubitem, pSub1, 0);
    return 1;
  }

  /* Defer deleting the Table object associated with the
  ** subquery until code generation is
  ** complete, since there may still exist Expr.pTab entries that
  ** refer to the subquery even after flattening.  Ticket #3346.
  **
  ** pSubitem->pTab is always non-NULL by test restrictions and tests above.
  */
  if( ALWAYS(pSubitem->pSTab!=0) ){
    Table *pTabToDel = pSubitem->pSTab;
    if( pTabToDel->nTabRef==1 ){
      Parse *pToplevel = sqlite3ParseToplevel(pParse);
      sqlite3ParserAddCleanup(pToplevel, sqlite3DeleteTableGeneric, pTabToDel);
      testcase( pToplevel->earlyCleanup );
    }else{
      pTabToDel->nTabRef--;
    }
    pSubitem->pSTab = 0;
  }

  /* The following loop runs once for each term in a compound-subquery
  ** flattening (as described above).  If we are doing a different kind
  ** of flattening - a flattening other than a compound-subquery flattening -
  ** then this loop only runs once.
  **
  ** This loop moves all of the FROM elements of the subquery into the
  ** the FROM clause of the outer query.  Before doing this, remember
  ** the cursor number for the original outer query FROM element in
  ** iParent.  The iParent cursor will never be used.  Subsequent code
  ** will scan expressions looking for iParent references and replace
  ** those references with expressions that resolve to the subquery FROM
  ** elements we are now copying in.
  */
  pSub = pSub1;
  for(pParent=p; pParent; pParent=pParent->pPrior, pSub=pSub->pPrior){
    int nSubSrc;
    u8 jointype = 0;
    u8 ltorj = pSrc->a[iFrom].fg.jointype & JT_LTORJ;
    assert( pSub!=0 );
    pSubSrc = pSub->pSrc;     /* FROM clause of subquery */
    nSubSrc = pSubSrc->nSrc;  /* Number of terms in subquery FROM clause */
    pSrc = pParent->pSrc;     /* FROM clause of the outer query */

    if( pParent==p ){
      jointype = pSubitem->fg.jointype;     /* First time through the loop */
    }

    /* The subquery uses a single slot of the FROM clause of the outer
    ** query.  If the subquery has more than one element in its FROM clause,
    ** then expand the outer query to make space for it to hold all elements
    ** of the subquery.
    **
    ** Example:
    **
    **    SELECT * FROM tabA, (SELECT * FROM sub1, sub2), tabB;
    **
    ** The outer query has 3 slots in its FROM clause.  One slot of the
    ** outer query (the middle slot) is used by the subquery.  The next
    ** block of code will expand the outer query FROM clause to 4 slots.
    ** The middle slot is expanded to two slots in order to make space
    ** for the two elements in the FROM clause of the subquery.
    */
    if( nSubSrc>1 ){
      pSrc = sqlite3SrcListEnlarge(pParse, pSrc, nSubSrc-1,iFrom+1);
      if( pSrc==0 ) break;
      pParent->pSrc = pSrc;
    }

    /* Transfer the FROM clause terms from the subquery into the
    ** outer query.
    */
    iNewParent = pSubSrc->a[0].iCursor;
    for(i=0; i<nSubSrc; i++){
      SrcItem *pItem = &pSrc->a[i+iFrom];
      assert( pItem->fg.isTabFunc==0 );
      assert( pItem->fg.isSubquery
           || pItem->fg.fixedSchema
           || pItem->u4.zDatabase==0 );
      if( pItem->fg.isUsing ) sqlite3IdListDelete(db, pItem->u3.pUsing);
      *pItem = pSubSrc->a[i];
      pItem->fg.jointype |= ltorj;
      memset(&pSubSrc->a[i], 0, sizeof(pSubSrc->a[i]));
    }
    pSrc->a[iFrom].fg.jointype &= JT_LTORJ;
    pSrc->a[iFrom].fg.jointype |= jointype | ltorj;

    /* Now begin substituting subquery result set expressions for
    ** references to the iParent in the outer query.
    **
    ** Example:
    **
    **   SELECT a+5, b*10 FROM (SELECT x*3 AS a, y+10 AS b FROM t1) WHERE a>b;
    **   \                     \_____________ subquery __________/          /
    **    \_____________________ outer query ______________________________/
    **
    ** We look at every expression in the outer query and every place we see
    ** "a" we substitute "x*3" and every place we see "b" we substitute "y+10".
    */
    if( pSub->pOrderBy && (pParent->selFlags & SF_NoopOrderBy)==0 ){
      /* At this point, any non-zero iOrderByCol values indicate that the
      ** ORDER BY column expression is identical to the iOrderByCol'th
      ** expression returned by SELECT statement pSub. Since these values
      ** do not necessarily correspond to columns in SELECT statement pParent,
      ** zero them before transferring the ORDER BY clause.
      **
      ** Not doing this may cause an error if a subsequent call to this
      ** function attempts to flatten a compound sub-query into pParent
      ** (the only way this can happen is if the compound sub-query is
      ** currently part of pSub->pSrc). See ticket [d11a6e908f].  */
      ExprList *pOrderBy = pSub->pOrderBy;
      for(i=0; i<pOrderBy->nExpr; i++){
        pOrderBy->a[i].u.x.iOrderByCol = 0;
      }
      assert( pParent->pOrderBy==0 );
      pParent->pOrderBy = pOrderBy;
      pSub->pOrderBy = 0;
    }
    pWhere = pSub->pWhere;
    pSub->pWhere = 0;
    if( isOuterJoin>0 ){
      assert( pSubSrc->nSrc==1 );
      sqlite3SetJoinExpr(pWhere, iNewParent, EP_OuterON);
    }
    if( pWhere ){
      if( pParent->pWhere ){
        pParent->pWhere = sqlite3PExpr(pParse, TK_AND, pWhere, pParent->pWhere);
      }else{
        pParent->pWhere = pWhere;
      }
    }
    if( db->mallocFailed==0 ){
      SubstContext x;
      x.pParse = pParse;
      x.iTable = iParent;
      x.iNewTable = iNewParent;
      x.isOuterJoin = isOuterJoin;
      x.pEList = pSub->pEList;
      x.pCList = findLeftmostExprlist(pSub);
      substSelect(&x, pParent, 0);
    }

    /* The flattened query is a compound if either the inner or the
    ** outer query is a compound. */
    pParent->selFlags |= pSub->selFlags & SF_Compound;
    assert( (pSub->selFlags & SF_Distinct)==0 ); /* restriction (17b) */

    /*
    ** SELECT ... FROM (SELECT ... LIMIT a OFFSET b) LIMIT x OFFSET y;
    **
    ** One is tempted to try to add a and b to combine the limits.  But this
    ** does not work if either limit is negative.
    */
    if( pSub->pLimit ){
      pParent->pLimit = pSub->pLimit;
      pSub->pLimit = 0;
    }

    /* Recompute the SrcItem.colUsed masks for the flattened
    ** tables. */
    for(i=0; i<nSubSrc; i++){
      recomputeColumnsUsed(pParent, &pSrc->a[i+iFrom]);
    }
  }

  /* Finally, delete what is left of the subquery and return success.
  */
  sqlite3AggInfoPersistWalkerInit(&w, pParse);
  sqlite3WalkSelect(&w,pSub1);
  sqlite3SelectDelete(db, pSub1);

#if TREETRACE_ENABLED
  if( sqlite3TreeTrace & 0x4 ){
    TREETRACE(0x4,pParse,p,("After flattening:\n"));
    sqlite3TreeViewSelect(0, p, 0);
  }
#endif

  return 1;
}